

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O0

int AF_A_WeaponReady(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  AActor *self_00;
  DObject *this;
  bool bVar1;
  bool local_52;
  bool local_4f;
  uint local_4c;
  int flags;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                  ,0x2e7,"int AF_A_WeaponReady(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar1 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar1 = true, (param->field_0).field_1.atag != 1)) {
    bVar1 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar1) {
    self_00 = *(AActor **)&param->field_0;
    local_4f = true;
    if (self_00 != (AActor *)0x0) {
      local_4f = DObject::IsKindOf((DObject *)self_00,AActor::RegistrationInfo.MyClass);
    }
    if (local_4f != false) {
      if ((1 < numparam) && (param[1].field_0.field_3.Type != 0xff)) {
        bVar1 = false;
        if ((param[1].field_0.field_3.Type == '\x03') &&
           (bVar1 = true, param[1].field_0.field_1.atag != 1)) {
          bVar1 = param[1].field_0.field_1.a == (void *)0x0;
        }
        if (!bVar1) {
          __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                        ,0x2e7,
                        "int AF_A_WeaponReady(VMFrameStack *, VMValue *, int, VMReturn *, int)");
        }
        this = (DObject *)param[1].field_0.field_1.a;
        local_52 = true;
        if (this != (DObject *)0x0) {
          local_52 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
        }
        if (local_52 == false) {
          __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                        ,0x2e7,
                        "int AF_A_WeaponReady(VMFrameStack *, VMValue *, int, VMReturn *, int)");
        }
      }
      if ((2 < numparam) && (param[2].field_0.field_3.Type != 0xff)) {
        bVar1 = false;
        if ((param[2].field_0.field_3.Type == '\x03') &&
           (bVar1 = true, param[2].field_0.field_1.atag != 8)) {
          bVar1 = param[2].field_0.field_1.a == (void *)0x0;
        }
        if (!bVar1) {
          __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                        ,0x2e7,
                        "int AF_A_WeaponReady(VMFrameStack *, VMValue *, int, VMReturn *, int)");
        }
      }
      if ((numparam < 4) || (param[3].field_0.field_3.Type == 0xff)) {
        local_4c = 0;
      }
      else {
        if (param[3].field_0.field_3.Type != '\0') {
          __assert_fail("param[paramnum].Type == REGT_INT",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                        ,0x2e8,
                        "int AF_A_WeaponReady(VMFrameStack *, VMValue *, int, VMReturn *, int)");
        }
        local_4c = param[3].field_0.i;
      }
      DoReadyWeaponToSwitch(self_00,(bool)(((local_4c & 2) != 0 ^ 0xffU) & 1));
      if ((local_4c & 0xc) != 0xc) {
        DoReadyWeaponToFire(self_00,(bool)(((local_4c & 4) != 0 ^ 0xffU) & 1),
                            (bool)(((local_4c & 8) != 0 ^ 0xffU) & 1));
      }
      if ((local_4c & 1) == 0) {
        DoReadyWeaponToBob(self_00);
      }
      DoReadyWeaponToGeneric(self_00,local_4c);
      DoReadyWeaponDisableSwitch(self_00,local_4c & 0x40);
      return 0;
    }
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                  ,0x2e7,"int AF_A_WeaponReady(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                ,0x2e7,"int AF_A_WeaponReady(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION_PARAMS(AInventory, A_WeaponReady)
{
	PARAM_ACTION_PROLOGUE;
	PARAM_INT_OPT(flags)	{ flags = 0; }

													DoReadyWeaponToSwitch(self, !(flags & WRF_NoSwitch));
	if ((flags & WRF_NoFire) != WRF_NoFire)			DoReadyWeaponToFire(self, !(flags & WRF_NoPrimary), !(flags & WRF_NoSecondary));
	if (!(flags & WRF_NoBob))						DoReadyWeaponToBob(self);
													DoReadyWeaponToGeneric(self, flags);
	DoReadyWeaponDisableSwitch(self, flags & WRF_DisableSwitch);
	return 0;
}